

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

ValuedAction __thiscall despot::POMCP::Search(POMCP *this,double timeout)

{
  Belief *pBVar1;
  State *pSVar2;
  DSPOMDP *pDVar3;
  pointer piVar4;
  pointer piVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  clock_t cVar10;
  VNode *pVVar11;
  ulong uVar12;
  log_ostream *plVar13;
  ostream *poVar14;
  clock_t cVar15;
  QNode *pQVar16;
  ACT_TYPE action;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  ValuedAction VVar21;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  ValuedAction astar;
  
  cVar10 = clock();
  dVar19 = get_time_second();
  if (this->root_ == (VNode *)0x0) {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])
              (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>,
               pBVar1,1);
    pSVar2 = *particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
              (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
    pVVar11 = CreateVNode(0,pSVar2,this->prior_,(this->super_Solver).model_);
    this->root_ = pVVar11;
    pDVar3 = (this->super_Solver).model_;
    (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,pSVar2);
  }
  piVar4 = (this->super_Solver).history_.actions_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  piVar5 = (this->super_Solver).history_.actions_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar8 = 0;
  do {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(&particles,pBVar1,1000);
    uVar17 = 0;
    do {
      uVar12 = uVar17;
      uVar18 = (long)particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      iVar9 = (int)uVar12;
      if (uVar18 <= uVar12) goto LAB_00172adb;
      pSVar2 = particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar12];
      iVar6 = logging::level();
      if ((0 < iVar6) && (iVar6 = logging::level(), 3 < iVar6)) {
        plVar13 = logging::stream(4);
        poVar14 = std::operator<<(&plVar13->super_ostream,"[POMCP::Search] Starting simulation ");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8 + iVar9);
        std::endl<char,std::char_traits<char>>(poVar14);
      }
      Simulate(pSVar2,this->root_,(this->super_Solver).model_,this->prior_);
      iVar6 = logging::level();
      if ((0 < iVar6) && (iVar6 = logging::level(), 3 < iVar6)) {
        plVar13 = logging::stream(4);
        poVar14 = std::operator<<(&plVar13->super_ostream,"[POMCP::Search] ");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8 + iVar9 + 1);
        poVar14 = std::operator<<(poVar14," simulations done");
        std::endl<char,std::char_traits<char>>(poVar14);
      }
      History::Truncate(&(this->super_Solver).history_,
                        (int)((ulong)((long)piVar4 - (long)piVar5) >> 2));
      cVar15 = clock();
      uVar17 = uVar12 + 1;
    } while (((double)cVar15 - (double)cVar10) / 1000000.0 < timeout);
    iVar9 = (int)(uVar12 + 1);
LAB_00172adb:
    iVar8 = iVar8 + iVar9;
    for (uVar17 = 0;
        uVar17 < (ulong)((long)particles.
                               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)particles.
                               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar17 = uVar17 + 1)
    {
      pDVar3 = (this->super_Solver).model_;
      (*pDVar3->_vptr_DSPOMDP[0x17])
                (pDVar3,particles.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17]);
    }
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
              (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
    if (uVar12 < uVar18) {
      VVar21 = OptimalAction(this->root_);
      astar.value = VVar21.value;
      uVar7 = VVar21.action;
      astar.action = uVar7;
      iVar8 = logging::level();
      if ((0 < iVar8) && (iVar8 = logging::level(), 2 < iVar8)) {
        plVar13 = logging::stream(3);
        poVar14 = std::operator<<(&plVar13->super_ostream,"[POMCP::Search] Search statistics");
        poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
        poVar14 = std::operator<<(poVar14,"OptimalAction = ");
        poVar14 = despot::operator<<(poVar14,&astar);
        poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
        poVar14 = std::operator<<(poVar14,"# Simulations = ");
        iVar8 = VNode::count(this->root_);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8);
        poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
        std::operator<<(poVar14,"Time: CPU / Real = ");
        cVar15 = clock();
        poVar14 = std::ostream::_M_insert<double>(((double)cVar15 - (double)cVar10) / 1000000.0);
        std::operator<<(poVar14," / ");
        dVar20 = get_time_second();
        poVar14 = std::ostream::_M_insert<double>(dVar20 - dVar19);
        poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
        poVar14 = std::operator<<(poVar14,"# active particles = ");
        iVar8 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[0x18])();
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8);
        poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
        poVar14 = std::operator<<(poVar14,"Tree size = ");
        iVar8 = VNode::Size(this->root_);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8);
        std::endl<char,std::char_traits<char>>(poVar14);
        uVar7 = astar.action;
      }
      if (uVar7 == 0xffffffff) {
        for (iVar8 = 0; iVar9 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])(),
            uVar7 = astar.action, iVar8 < iVar9; iVar8 = iVar8 + 1) {
          poVar14 = std::operator<<((ostream *)&std::cout,"action ");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar8);
          poVar14 = std::operator<<(poVar14,": ");
          pQVar16 = VNode::Child(this->root_,iVar8);
          iVar9 = QNode::count(pQVar16);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar9);
          std::operator<<(poVar14," ");
          pQVar16 = VNode::Child(this->root_,iVar8);
          dVar19 = QNode::value(pQVar16);
          poVar14 = std::ostream::_M_insert<double>(dVar19);
          std::endl<char,std::char_traits<char>>(poVar14);
        }
      }
      VVar21._4_4_ = 0;
      VVar21.action = uVar7;
      VVar21.value = astar.value;
      return VVar21;
    }
  } while( true );
}

Assistant:

ValuedAction POMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	if (root_ == NULL) {
		State* state = belief_->Sample(1)[0];
		root_ = CreateVNode(0, state, prior_, model_);
		model_->Free(state);
	}

	int hist_size = history_.Size();
	bool done = false;
	int num_sims = 0;
	while (true) {
		vector<State*> particles = belief_->Sample(1000);
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			logd << "[POMCP::Search] Starting simulation " << num_sims << endl;

			Simulate(particle, root_, model_, prior_);
 
			num_sims++;
			logd << "[POMCP::Search] " << num_sims << " simulations done" << endl;
			history_.Truncate(hist_size);

			if ((clock() - start_cpu) / CLOCKS_PER_SEC >= timeout) {
				done = true;
				break;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			model_->Free(particles[i]);
		}

		if (done)
			break;
	}

	ValuedAction astar = OptimalAction(root_);

	logi << "[POMCP::Search] Search statistics" << endl
		<< "OptimalAction = " << astar << endl 
		<< "# Simulations = " << root_->count() << endl
		<< "Time: CPU / Real = " << ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / " << (get_time_second() - start_real) << endl
		<< "# active particles = " << model_->NumActiveParticles() << endl
		<< "Tree size = " << root_->Size() << endl;

	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	// delete root_;
	return astar;
}